

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

ComputeTestFeatures vkt::SpirVAssembly::getConversionUsedFeatures(IntegerType from,IntegerType to)

{
  bool bVar1;
  IntegerType to_local;
  IntegerType from_local;
  
  bVar1 = usesInt16(from,to);
  if (bVar1) {
    bVar1 = usesInt64(from,to);
    if (bVar1) {
      to_local = INTEGER_TYPE_UNSIGNED_16;
    }
    else {
      to_local = INTEGER_TYPE_SIGNED_32;
    }
  }
  else {
    to_local = INTEGER_TYPE_SIGNED_64;
  }
  return to_local;
}

Assistant:

ComputeTestFeatures getConversionUsedFeatures (IntegerType from, IntegerType to)
{
	if (usesInt16(from, to))
	{
		if (usesInt64(from, to))
		{
			return COMPUTE_TEST_USES_INT16_INT64;
		}
		else
		{
			return COMPUTE_TEST_USES_INT16;
		}
	}
	else
	{
		return COMPUTE_TEST_USES_INT64;
	}
}